

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

size_type __thiscall
cmCTestMemCheckHandler::FindOrAddWarning(cmCTestMemCheckHandler *this,string *warning)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  size_t sVar2;
  size_t __n;
  iterator __position;
  string *__x;
  cmCTestMemCheckHandler *pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_type *psVar7;
  size_type sVar8;
  bool bVar9;
  int local_4c;
  string *local_48;
  cmCTestMemCheckHandler *local_40;
  pointer local_38;
  
  pbVar1 = (this->ResultStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->ResultStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar9 = lVar5 != 0;
  local_48 = warning;
  local_40 = this;
  if (bVar9) {
    uVar6 = lVar5 >> 5;
    local_38 = (warning->_M_dataplus)._M_p;
    sVar2 = warning->_M_string_length;
    psVar7 = &pbVar1->_M_string_length;
    sVar8 = 0;
    do {
      __n = *psVar7;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar7 + -1))->_M_dataplus)._M_p,local_38,__n), iVar4 == 0)))) {
        if (bVar9) {
          return sVar8;
        }
        break;
      }
      sVar8 = sVar8 + 1;
      bVar9 = sVar8 < uVar6;
      psVar7 = psVar7 + 4;
    } while (uVar6 + (uVar6 == 0) != sVar8);
  }
  pcVar3 = local_40;
  this_00 = &local_40->ResultStrings;
  local_4c = 0;
  __position._M_current =
       (local_40->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (local_40->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_40->GlobalResults,__position,&local_4c);
  }
  else {
    *__position._M_current = 0;
    (local_40->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __x = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pcVar3->ResultStringsLong,__x);
  return ((long)(pcVar3->ResultStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pcVar3->ResultStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
}

Assistant:

std::vector<int>::size_type cmCTestMemCheckHandler::FindOrAddWarning(
  const std::string& warning)
{
  for (std::vector<std::string>::size_type i = 0;
       i < this->ResultStrings.size(); ++i) {
    if (this->ResultStrings[i] == warning) {
      return i;
    }
  }
  this->GlobalResults.push_back(0); // this must stay the same size
  this->ResultStrings.push_back(warning);
  this->ResultStringsLong.push_back(warning);
  return this->ResultStrings.size() - 1;
}